

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestGroupExtension::~TestGroupExtension(TestGroupExtension *this)

{
  ~TestGroupExtension(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestGroupExtension::~TestGroupExtension() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestGroupExtension)
  SharedDtor(*this);
}